

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O2

string * __thiscall
cmCTestSVN::LoadInfo_abi_cxx11_(string *__return_storage_ptr__,cmCTestSVN *this,SVNInfo *svninfo)

{
  vector<const_char_*,_std::allocator<const_char_*>_> svn_info;
  OutputLogger err;
  InfoParser out;
  _Vector_base<const_char_*,_std::allocator<const_char_*>_> local_338;
  LineParser local_318;
  InfoParser local_2d8;
  
  local_338._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_338._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_338._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2d8.super_LineParser.super_OutputParser._vptr_OutputParser = (_func_int **)0x637016;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_338,(char **)&local_2d8);
  local_2d8.super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)(svninfo->LocalPath)._M_dataplus._M_p;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_338,(char **)&local_2d8);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  InfoParser::InfoParser(&local_2d8,this,"info-out> ",__return_storage_ptr__,svninfo);
  cmProcessTools::OutputLogger::OutputLogger
            ((OutputLogger *)&local_318,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
             "info-err> ");
  RunSVNCommand(this,(vector<const_char_*,_std::allocator<const_char_*>_> *)&local_338,
                (OutputParser *)&local_2d8,&local_318.super_OutputParser);
  cmProcessTools::LineParser::~LineParser(&local_318);
  InfoParser::~InfoParser(&local_2d8);
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base(&local_338);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTestSVN::LoadInfo(SVNInfo& svninfo)
{
  // Run "svn info" to get the repository info from the work tree.
  std::vector<const char*> svn_info;
  svn_info.push_back("info");
  svn_info.push_back(svninfo.LocalPath.c_str());
  std::string rev;
  InfoParser out(this, "info-out> ", rev, svninfo);
  OutputLogger err(this->Log, "info-err> ");
  this->RunSVNCommand(svn_info, &out, &err);
  return rev;
}